

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O3

void __thiscall Fl_Plugin_Manager::Fl_Plugin_Manager(Fl_Plugin_Manager *this,char *klass)

{
  char *in_RAX;
  Name local_18;
  
  local_18.data_ = in_RAX;
  Fl_Preferences::Name::Name(&local_18,"%s/%s","plugins",klass);
  Fl_Preferences::Fl_Preferences(&this->super_Fl_Preferences,(Fl_Preferences *)0x0,local_18.data_);
  if (local_18.data_ != (char *)0x0) {
    free(local_18.data_);
  }
  (this->super_Fl_Preferences)._vptr_Fl_Preferences = (_func_int **)&PTR__Fl_Plugin_Manager_002552f8
  ;
  return;
}

Assistant:

Fl_Plugin_Manager::Fl_Plugin_Manager(const char *klass)
: Fl_Preferences(0, Fl_Preferences::Name("%s/%s", "plugins", klass)) {
#ifdef FL_PLUGIN_VERBOSE
  printf("Fl_Plugin: creating a plugin manager for class \"%s\"\n", klass);
#endif
}